

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmUtility.cpp
# Opt level: O0

GMM_RESOURCE_FORMAT
GmmLib::Utility::GmmGetFormatForASTC
          (uint8_t HDR,uint8_t Float,uint32_t BlockWidth,uint32_t BlockHeight,uint32_t BlockDepth)

{
  uint uVar1;
  uint local_58;
  uint local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  uint local_20;
  uint local_1c;
  GMM_SURFACESTATE_FORMAT_ASTC Format;
  uint32_t BlockDepth_local;
  uint32_t BlockHeight_local;
  uint32_t BlockWidth_local;
  uint8_t Float_local;
  uint8_t HDR_local;
  
  local_1c = BlockDepth;
  Format = (GMM_SURFACESTATE_FORMAT_ASTC)BlockHeight;
  BlockDepth_local = BlockWidth;
  BlockHeight_local._2_1_ = Float;
  BlockHeight_local._3_1_ = HDR;
  memset(&local_20,0,4);
  if (local_1c == 0) {
    local_1c = 1;
  }
  uVar1 = (uint)(BlockHeight_local._3_1_ != '\0') << 8 |
          (uint)(BlockHeight_local._2_1_ != '\0') << 6;
  if ((((((((((BlockDepth_local == 4) && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x4)) &&
            (local_1c == 1)) ||
           (((BlockDepth_local == 5 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x4)) &&
            (local_1c == 1)))) ||
          (((((BlockDepth_local == 5 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x5)) &&
             (local_1c == 1)) ||
            (((BlockDepth_local == 6 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x5)) &&
             (local_1c == 1)))) ||
           ((((BlockDepth_local == 6 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x6)) &&
             (local_1c == 1)) ||
            ((((BlockDepth_local == 8 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x5)) &&
              (local_1c == 1)) ||
             (((BlockDepth_local == 8 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x6)) &&
              (local_1c == 1)))))))))) ||
         (((((BlockDepth_local == 8 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x8)) &&
            (local_1c == 1)) ||
           (((((BlockDepth_local == 10 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x5)) &&
              (local_1c == 1)) ||
             ((((BlockDepth_local == 10 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x6)) &&
               (local_1c == 1)) ||
              (((BlockDepth_local == 10 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x8)) &&
               (local_1c == 1)))))) ||
            (((BlockDepth_local == 10 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0xa)) &&
             (local_1c == 1)))))) ||
          (((((BlockDepth_local == 0xc && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0xa)) &&
             (local_1c == 1)) ||
            (((BlockDepth_local == 0xc && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0xc)) &&
             (local_1c == 1)))) ||
           ((((BlockDepth_local == 3 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x3)) &&
             (local_1c == 3)) ||
            ((((BlockDepth_local == 4 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x3)) &&
              (local_1c == 3)) ||
             (((BlockDepth_local == 4 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x4)) &&
              (local_1c == 3)))))))))))) ||
        (((((BlockDepth_local == 4 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x4)) &&
           (local_1c == 4)) ||
          ((((((BlockDepth_local == 5 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x4)) &&
              (local_1c == 4)) ||
             (((BlockDepth_local == 5 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x5)) &&
              (local_1c == 4)))) ||
            (((BlockDepth_local == 5 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x5)) &&
             (local_1c == 5)))) ||
           ((((BlockDepth_local == 6 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x5)) &&
             (local_1c == 5)) ||
            (((((BlockDepth_local == 6 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x6)) &&
               (local_1c == 5)) ||
              ((((BlockDepth_local == 6 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x6)) &&
                (local_1c == 6)) ||
               (((BlockDepth_local == 4 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x4)) &&
                (local_1c == 1)))))) ||
             (((BlockDepth_local == 4 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x4)) &&
              (local_1c == 1)))))))))) ||
         (((BlockDepth_local == 5 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x4)) &&
          (local_1c == 1)))))) ||
       (((((((BlockDepth_local == 5 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x4)) &&
            (local_1c == 1)) ||
           (((BlockDepth_local == 5 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x5)) &&
            (local_1c == 1)))) ||
          (((BlockDepth_local == 5 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x5)) &&
           (local_1c == 1)))) ||
         (((BlockDepth_local == 6 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x5)) &&
          (local_1c == 1)))) ||
        (((((BlockDepth_local == 6 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x5)) &&
           (local_1c == 1)) ||
          (((((BlockDepth_local == 6 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x6)) &&
             (local_1c == 1)) ||
            (((BlockDepth_local == 6 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x6)) &&
             (local_1c == 1)))) ||
           (((BlockDepth_local == 8 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x5)) &&
            (local_1c == 1)))))) ||
         (((((BlockDepth_local == 8 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x5)) &&
            (local_1c == 1)) ||
           ((((BlockDepth_local == 8 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x6)) &&
             (local_1c == 1)) ||
            (((BlockDepth_local == 8 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x6)) &&
             (local_1c == 1)))))) ||
          ((((BlockDepth_local == 8 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x8)) &&
            (local_1c == 1)) ||
           (((BlockDepth_local == 8 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x8)) &&
            (local_1c == 1)))))))))))) ||
      (((BlockDepth_local == 10 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x5)) && (local_1c == 1)
       ))) || (((((((((BlockDepth_local == 10 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x5)) &&
                     (local_1c == 1)) ||
                    ((((((BlockDepth_local == 10 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x6))
                        && (local_1c == 1)) ||
                       (((BlockDepth_local == 10 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x6))
                        && (local_1c == 1)))) ||
                      (((BlockDepth_local == 10 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x8)) &&
                       (local_1c == 1)))) ||
                     ((((BlockDepth_local == 10 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x8)) &&
                       (local_1c == 1)) ||
                      (((BlockDepth_local == 10 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0xa)) &&
                       (local_1c == 1)))))))) ||
                   (((BlockDepth_local == 10 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0xa)) &&
                    (local_1c == 1)))) ||
                  ((((((BlockDepth_local == 0xc && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0xa)) &&
                      (local_1c == 1)) ||
                     (((BlockDepth_local == 0xc && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0xa)) &&
                      (local_1c == 1)))) ||
                    ((((((BlockDepth_local == 0xc && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0xc))
                        && (local_1c == 1)) ||
                       (((BlockDepth_local == 0xc && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0xc))
                        && (local_1c == 1)))) ||
                      (((BlockDepth_local == 3 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x3)) &&
                       (local_1c == 3)))) ||
                     ((((BlockDepth_local == 3 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x3)) &&
                       (local_1c == 3)) ||
                      ((((((BlockDepth_local == 4 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x3))
                          && (local_1c == 3)) ||
                         (((BlockDepth_local == 4 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x3))
                          && (local_1c == 3)))) ||
                        (((BlockDepth_local == 4 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x4))
                         && (local_1c == 3)))) ||
                       (((BlockDepth_local == 4 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x4)) &&
                        (local_1c == 3)))))))))) ||
                   (((BlockDepth_local == 4 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x4)) &&
                    (local_1c == 4)))))) ||
                 ((((BlockDepth_local == 4 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x4)) &&
                   (local_1c == 4)) ||
                  (((BlockDepth_local == 5 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x4)) &&
                   (local_1c == 4)))))) ||
                (((BlockDepth_local == 5 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x4)) &&
                 (local_1c == 4)))) ||
               ((((((BlockDepth_local == 5 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x5)) &&
                   (local_1c == 4)) ||
                  (((((((BlockDepth_local == 5 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x5)) &&
                       (local_1c == 4)) ||
                      (((BlockDepth_local == 5 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x5)) &&
                       (local_1c == 5)))) ||
                     (((BlockDepth_local == 5 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x5)) &&
                      (local_1c == 5)))) ||
                    (((BlockDepth_local == 6 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x5)) &&
                     (local_1c == 5)))) ||
                   (((BlockDepth_local == 6 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x5)) &&
                    (local_1c == 5)))))) ||
                 ((((BlockDepth_local == 6 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x6)) &&
                   (local_1c == 5)) ||
                  ((((BlockDepth_local == 6 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x6)) &&
                    (local_1c == 5)) ||
                   (((BlockDepth_local == 6 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x6)) &&
                    (local_1c == 6)))))))) ||
                (((BlockDepth_local == 6 && (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x6)) &&
                 (local_1c == 6)))))))) {
    if (local_1c < 2) {
      if (BlockDepth_local == 4) {
        local_24 = 0;
      }
      else {
        if (BlockDepth_local == 5) {
          local_28 = 1;
        }
        else {
          if (BlockDepth_local == 6) {
            local_2c = 2;
          }
          else {
            if (BlockDepth_local == 8) {
              local_30 = 4;
            }
            else {
              local_30 = 7;
              if (BlockDepth_local == 10) {
                local_30 = 6;
              }
            }
            local_2c = local_30;
          }
          local_28 = local_2c;
        }
        local_24 = local_28;
      }
      if (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x4) {
        local_34 = 0;
      }
      else {
        if (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x5) {
          local_38 = 1;
        }
        else {
          if (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x6) {
            local_3c = 2;
          }
          else {
            if (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x8) {
              local_40 = 4;
            }
            else {
              local_40 = 7;
              if (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0xa) {
                local_40 = 6;
              }
            }
            local_3c = local_40;
          }
          local_38 = local_3c;
        }
        local_34 = local_38;
      }
      local_20 = uVar1 | local_24 << 3 | local_34;
    }
    else {
      if (BlockDepth_local == 3) {
        local_44 = 0;
      }
      else {
        if (BlockDepth_local == 4) {
          local_48 = 1;
        }
        else {
          local_48 = 3;
          if (BlockDepth_local == 5) {
            local_48 = 2;
          }
        }
        local_44 = local_48;
      }
      if (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x3) {
        local_4c = 0;
      }
      else {
        if (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x4) {
          local_50 = 1;
        }
        else {
          local_50 = 3;
          if (Format == (GMM_SURFACESTATE_FORMAT_ASTC)0x5) {
            local_50 = 2;
          }
        }
        local_4c = local_50;
      }
      if (local_1c == 3) {
        local_54 = 0;
      }
      else {
        if (local_1c == 4) {
          local_58 = 1;
        }
        else {
          local_58 = 3;
          if (local_1c == 5) {
            local_58 = 2;
          }
        }
        local_54 = local_58;
      }
      local_20 = uVar1 | 0x80 | local_44 << 4 | local_4c << 2 | local_54;
    }
    BlockWidth_local = local_20;
  }
  else {
    BlockWidth_local = 0;
  }
  return BlockWidth_local;
}

Assistant:

GMM_RESOURCE_FORMAT GMM_STDCALL GmmGetFormatForASTC(uint8_t HDR, uint8_t Float, uint32_t BlockWidth, uint32_t BlockHeight, uint32_t BlockDepth)
        {
            // Full enums/etc. in case we ever need to typedef them...
            enum GMM_SURFACESTATE_FORMAT_ASTC_DYNAMIC_RANGE
            {
                GMM_SURFACESTATE_FORMAT_ASTC_DYNAMIC_RANGE_LDR = 0,
                GMM_SURFACESTATE_FORMAT_ASTC_DYNAMIC_RANGE_HDR = 1,
            };

            enum GMM_SURFACESTATE_FORMAT_ASTC_BLOCK_DIMENSION
            {
                GMM_SURFACESTATE_FORMAT_ASTC_BLOCK_DIMENSION_2D = 0,
                GMM_SURFACESTATE_FORMAT_ASTC_BLOCK_DIMENSION_3D = 1,
            };

            enum GMM_SURFACESTATE_FORMAT_ASTC_DECODE_FORMAT
            {
                GMM_SURFACESTATE_FORMAT_ASTC_DECODE_FORMAT_UNORM8_sRGB = 0,
                GMM_SURFACESTATE_FORMAT_ASTC_DECODE_FORMAT_FLOAT16     = 1,
            };

            enum GMM_SURFACESTATE_FORMAT_ASTC_2D_BLOCK_SIZE
            {
                GMM_SURFACESTATE_FORMAT_ASTC_2D_BLOCK_SIZE_4px   = 0,
                GMM_SURFACESTATE_FORMAT_ASTC_2D_BLOCK_SIZE_5px   = 1,
                GMM_SURFACESTATE_FORMAT_ASTC_2D_BLOCK_SIZE_6px   = 2,
                __GMM_SURFACESTATE_FORMAT_ASTC_2D_BLOCK_SIZE_0x3 = 3,
                GMM_SURFACESTATE_FORMAT_ASTC_2D_BLOCK_SIZE_8px   = 4,
                __GMM_SURFACESTATE_FORMAT_ASTC_2D_BLOCK_SIZE_0x5 = 5,
                GMM_SURFACESTATE_FORMAT_ASTC_2D_BLOCK_SIZE_10px  = 6,
                GMM_SURFACESTATE_FORMAT_ASTC_2D_BLOCK_SIZE_12px  = 7,
            };

            enum GMM_SURFACESTATE_FORMAT_ASTC_3D_BLOCK_SIZE
            {
                GMM_SURFACESTATE_FORMAT_ASTC_3D_BLOCK_SIZE_3px = 0,
                GMM_SURFACESTATE_FORMAT_ASTC_3D_BLOCK_SIZE_4px = 1,
                GMM_SURFACESTATE_FORMAT_ASTC_3D_BLOCK_SIZE_5px = 2,
                GMM_SURFACESTATE_FORMAT_ASTC_3D_BLOCK_SIZE_6px = 3,
            };

            union GMM_SURFACESTATE_FORMAT_ASTC {
                struct // Common Fields...
                {
                    uint32_t Reserved1 : 6;      // [2D/3D-Specific Fields]
                    uint32_t DecodeFormat : 1;   // GMM_SURFACESTATE_FORMAT_ASTC_DECODE_FORMAT
                    uint32_t BlockDimension : 1; // GMM_SURFACESTATE_FORMAT_ASTC_BLOCK_DIMENSION
                    uint32_t DynamicRange : 1;   // GMM_SURFACESTATE_FORMAT_ASTC_DYNAMIC_RANGE
                    uint32_t Reserved2 : 23;
                };
                struct // 2D-Specific Fields...
                {
                    uint32_t BlockHeight2D : 3; // GMM_SURFACESTATE_FORMAT_ASTC_2D_BLOCK_SIZE
                    uint32_t BlockWidth2D : 3;  // GMM_SURFACESTATE_FORMAT_ASTC_2D_BLOCK_SIZE
                    uint32_t Reserved3 : 3;     // [Common Fields]
                    uint32_t Reserved4 : 23;
                };
                struct // 3D-Specific Fields...
                {
                    uint32_t BlockDepth3D : 2;  // GMM_SURFACESTATE_FORMAT_ASTC_3D_BLOCK_SIZE
                    uint32_t BlockHeight3D : 2; // GMM_SURFACESTATE_FORMAT_ASTC_3D_BLOCK_SIZE
                    uint32_t BlockWidth3D : 2;  // GMM_SURFACESTATE_FORMAT_ASTC_3D_BLOCK_SIZE
                    uint32_t Reserved5 : 3;     // [Common Fields]
                    uint32_t Reserved6 : 23;
                };
                struct
                {
                    uint32_t Value : 9;
                    uint32_t Reserved7 : 23;
                };
            } Format = {0};
            C_ASSERT(sizeof(union GMM_SURFACESTATE_FORMAT_ASTC) == sizeof(uint32_t));

            // TODO(Minor): Verify and fail for invalid HDR/sRGB combinations.

            if(BlockDepth == 0)
                BlockDepth = 1;

            Format.DynamicRange = HDR ?
                                  GMM_SURFACESTATE_FORMAT_ASTC_DYNAMIC_RANGE_HDR :
                                  GMM_SURFACESTATE_FORMAT_ASTC_DYNAMIC_RANGE_LDR;

            Format.DecodeFormat = Float ?
                                  GMM_SURFACESTATE_FORMAT_ASTC_DECODE_FORMAT_FLOAT16 :
                                  GMM_SURFACESTATE_FORMAT_ASTC_DECODE_FORMAT_UNORM8_sRGB;

            // Validate Block Dimensions...
            if(!(
#define GMM_FORMAT_INCLUDE_ASTC_FORMATS_ONLY
#define GMM_FORMAT(Name, bpe, Width, Height, Depth, IsRT, IsASTC, RcsSurfaceFormat, SSCompressionFmt, Availability) \
    ((BlockWidth == (Width)) && (BlockHeight == (Height)) && (BlockDepth == (Depth))) ||
#include "External/Common/GmmFormatTable.h"
               0)) // <-- 0 benignly terminates the chain of OR expressions.
            {
                goto Invalid;
            }

            if(BlockDepth <= 1)
            {
                Format.BlockDimension = GMM_SURFACESTATE_FORMAT_ASTC_BLOCK_DIMENSION_2D;

                // clang-format off
                Format.BlockWidth2D =
                    (BlockWidth ==  4) ? GMM_SURFACESTATE_FORMAT_ASTC_2D_BLOCK_SIZE_4px :
                    (BlockWidth ==  5) ? GMM_SURFACESTATE_FORMAT_ASTC_2D_BLOCK_SIZE_5px :
                    (BlockWidth ==  6) ? GMM_SURFACESTATE_FORMAT_ASTC_2D_BLOCK_SIZE_6px :
                    (BlockWidth ==  8) ? GMM_SURFACESTATE_FORMAT_ASTC_2D_BLOCK_SIZE_8px :
                    (BlockWidth == 10) ? GMM_SURFACESTATE_FORMAT_ASTC_2D_BLOCK_SIZE_10px :
                    GMM_SURFACESTATE_FORMAT_ASTC_2D_BLOCK_SIZE_12px;
                Format.BlockHeight2D =
                    (BlockHeight ==  4) ? GMM_SURFACESTATE_FORMAT_ASTC_2D_BLOCK_SIZE_4px :
                    (BlockHeight ==  5) ? GMM_SURFACESTATE_FORMAT_ASTC_2D_BLOCK_SIZE_5px :
                    (BlockHeight ==  6) ? GMM_SURFACESTATE_FORMAT_ASTC_2D_BLOCK_SIZE_6px :
                    (BlockHeight ==  8) ? GMM_SURFACESTATE_FORMAT_ASTC_2D_BLOCK_SIZE_8px :
                    (BlockHeight == 10) ? GMM_SURFACESTATE_FORMAT_ASTC_2D_BLOCK_SIZE_10px :
                    GMM_SURFACESTATE_FORMAT_ASTC_2D_BLOCK_SIZE_12px;
                // clang-format on
            }
            else
            {
                Format.BlockDimension = GMM_SURFACESTATE_FORMAT_ASTC_BLOCK_DIMENSION_3D;
                // clang-format off
                Format.BlockWidth3D =
                    (BlockWidth == 3) ? GMM_SURFACESTATE_FORMAT_ASTC_3D_BLOCK_SIZE_3px :
                    (BlockWidth == 4) ? GMM_SURFACESTATE_FORMAT_ASTC_3D_BLOCK_SIZE_4px :
                    (BlockWidth == 5) ? GMM_SURFACESTATE_FORMAT_ASTC_3D_BLOCK_SIZE_5px :
                    GMM_SURFACESTATE_FORMAT_ASTC_3D_BLOCK_SIZE_6px;
                Format.BlockHeight3D =
                    (BlockHeight == 3) ? GMM_SURFACESTATE_FORMAT_ASTC_3D_BLOCK_SIZE_3px :
                    (BlockHeight == 4) ? GMM_SURFACESTATE_FORMAT_ASTC_3D_BLOCK_SIZE_4px :
                    (BlockHeight == 5) ? GMM_SURFACESTATE_FORMAT_ASTC_3D_BLOCK_SIZE_5px :
                    GMM_SURFACESTATE_FORMAT_ASTC_3D_BLOCK_SIZE_6px;
                Format.BlockDepth3D =
                    (BlockDepth == 3) ? GMM_SURFACESTATE_FORMAT_ASTC_3D_BLOCK_SIZE_3px :
                    (BlockDepth == 4) ? GMM_SURFACESTATE_FORMAT_ASTC_3D_BLOCK_SIZE_4px :
                    (BlockDepth == 5) ? GMM_SURFACESTATE_FORMAT_ASTC_3D_BLOCK_SIZE_5px :
                    GMM_SURFACESTATE_FORMAT_ASTC_3D_BLOCK_SIZE_6px;
                // clang-format on
            }

            return ((GMM_RESOURCE_FORMAT)Format.Value);
        Invalid:
            return (GMM_FORMAT_INVALID);
        }